

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

bool __thiscall
HighsHashTree<int,_void>::InnerLeaf<1>::erase_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  difference_type __d_1;
  bool bVar13;
  
  uVar7 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = (uVar7 & 0xffff) >> 10;
  uVar6 = (this->occupation).occupation;
  if ((uVar6 >> uVar2 & 1) == 0) {
    return false;
  }
  lVar5 = POPCOUNT(uVar6 >> (sbyte)uVar2);
  lVar12 = 0;
  do {
    lVar11 = lVar12;
    lVar12 = lVar11 + 1;
  } while ((ushort)uVar2 < (ushort)((ushort)(this->hashes)._M_elems[lVar5 + lVar11 + -1] >> 10));
  uVar7 = uVar7 & 0xffff;
  iVar3 = (int)lVar5;
  lVar9 = lVar12;
  do {
    lVar8 = lVar9;
    lVar9 = lVar8 + 1;
  } while (uVar7 < *(ulong *)((long)(this->hashes)._M_elems +
                             lVar8 * 8 + (ulong)(uint)(iVar3 * 8) + -0x10));
  iVar1 = this->size;
  if (((iVar1 - iVar3) + 3 == (int)lVar9) || ((this->hashes)._M_elems[lVar5 + lVar8 + -2] != uVar7))
  {
    bVar13 = false;
    iVar10 = iVar3 + (int)lVar9 + -3;
  }
  else {
    do {
      bVar13 = *key == (this->entries)._M_elems[lVar5 + lVar9 + -3].value_;
      if (bVar13) {
        iVar10 = iVar3 + (int)lVar9 + -3;
        goto LAB_00273c0a;
      }
      iVar10 = iVar1;
      if ((iVar1 - iVar3) + 2 == (int)lVar9) goto LAB_00273c0a;
      lVar8 = lVar9 + 1;
      lVar4 = lVar9 + -2;
      lVar9 = lVar8;
    } while ((this->hashes)._M_elems[lVar5 + lVar4] == uVar7);
    iVar10 = iVar3 + (int)lVar8 + -3;
  }
LAB_00273c0a:
  if (bVar13 == false) {
    return false;
  }
  this->size = iVar1 + -1;
  if (iVar10 < iVar1 + -1) {
    lVar12 = (long)(iVar10 + 1);
    if (iVar1 != iVar10 + 1) {
      memmove((this->entries)._M_elems + iVar10,(this->entries)._M_elems + lVar12,
              (iVar1 - lVar12) * 4);
    }
    memmove((this->hashes)._M_elems + iVar10,(this->hashes)._M_elems + lVar12,
            ((long)this->size - (long)iVar10) * 8);
    if (*(ushort *)((long)(this->hashes)._M_elems + lVar11 * 8 + (ulong)(uint)(iVar3 * 8) + -8) >>
        10 == (ushort)uVar2) goto LAB_00273cc9;
    uVar6 = (this->occupation).occupation;
  }
  else if ((iVar10 - iVar3) + 2 != (int)lVar12) goto LAB_00273cc9;
  (this->occupation).occupation = uVar6 ^ 1L << (sbyte)uVar2;
LAB_00273cc9:
  (this->hashes)._M_elems[this->size] = 0;
  return bVar13;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }